

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_client.h
# Opt level: O2

void __thiscall blcl::net::client_interface<MsgType>::disconnect(client_interface<MsgType> *this)

{
  connection<MsgType> *this_00;
  
  this_00 = (this->connection_)._M_t.
            super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
            .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl;
  if ((this_00 != (connection<MsgType> *)0x0) &&
     ((((implementation_type *)
       ((long)&(this_00->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor> + 8))->
      super_base_implementation_type).socket_ != -1)) {
    connection<MsgType>::disconnect(this_00);
  }
  asio::io_context::stop(&this->context_);
  if ((this->ctx_thread_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  (this->connection_)._M_t.
  super___uniq_ptr_impl<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_blcl::net::connection<MsgType>_*,_std::default_delete<blcl::net::connection<MsgType>_>_>
  .super__Head_base<0UL,_blcl::net::connection<MsgType>_*,_false>._M_head_impl =
       (connection<MsgType> *)0x0;
  return;
}

Assistant:

void disconnect() {
            if (is_connected())
                connection_->disconnect();

            context_.stop();
            if (ctx_thread_.joinable())
                ctx_thread_.join();
            connection_.release();
        }